

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bio.c
# Opt level: O0

int32 bio_fwrite(void *buf,int32 el_sz,int32 n_el,FILE *fp,int32 swap,uint32 *chksum)

{
  uint32 uVar1;
  void *__dest;
  size_t sVar2;
  int rv;
  void *nbuf;
  uint32 *chksum_local;
  int32 swap_local;
  FILE *fp_local;
  int32 n_el_local;
  int32 el_sz_local;
  void *buf_local;
  
  if (chksum != (uint32 *)0x0) {
    uVar1 = chksum_accum(buf,el_sz,n_el,*chksum);
    *chksum = uVar1;
  }
  if (swap == 0) {
    sVar2 = fwrite(buf,(long)el_sz,(long)n_el,(FILE *)fp);
    buf_local._4_4_ = (int32)sVar2;
  }
  else {
    __dest = __ckd_calloc__((long)n_el,(long)el_sz,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/bio.c"
                            ,0x15f);
    memcpy(__dest,buf,(long)(n_el * el_sz));
    swap_buf(__dest,el_sz,n_el);
    sVar2 = fwrite(__dest,(long)el_sz,(long)n_el,(FILE *)fp);
    buf_local._4_4_ = (int32)sVar2;
    ckd_free(__dest);
  }
  return buf_local._4_4_;
}

Assistant:

int32
bio_fwrite(const void *buf, int32 el_sz, int32 n_el, FILE *fp,
           int32 swap, uint32 *chksum)
{
    if (chksum)
        *chksum = chksum_accum(buf, el_sz, n_el, *chksum);
    if (swap) {
        void *nbuf;
        int rv;

        nbuf = ckd_calloc(n_el, el_sz);
        memcpy(nbuf, buf, n_el * el_sz);
        swap_buf(nbuf, el_sz, n_el);
        rv = fwrite(nbuf, el_sz, n_el, fp);
        ckd_free(nbuf);
        return rv;
    }
    else {
        return fwrite(buf, el_sz, n_el, fp);
    }
}